

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

void qAddPostRoutine(QtCleanUpFunction p)

{
  QBasicMutex copy;
  QPodArrayOps<void(*)()> *this;
  long in_FS_OFFSET;
  QtCleanUpFunction local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_postRList>::guard._q_value.
                 super___atomic_base<signed_char>._M_i) {
    this = (QPodArrayOps<void(*)()> *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_postRList>_>::instance
                     ();
    if ((AtomicType)globalRoutinesMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
      LOCK();
      globalRoutinesMutex.d_ptr._q_value._M_b._M_p =
           (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
      UNLOCK();
    }
    else {
      QBasicMutex::lockInternal(&globalRoutinesMutex);
    }
    local_20 = p;
    QtPrivate::QPodArrayOps<void(*)()>::emplace<void(*&)()>(this,0,&local_20);
    copy = globalRoutinesMutex;
    LOCK();
    globalRoutinesMutex.d_ptr._q_value._M_b._M_p =
         (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex(&globalRoutinesMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qAddPostRoutine(QtCleanUpFunction p)
{
    QVFuncList *list = postRList();
    if (!list)
        return;
    const auto locker = qt_scoped_lock(globalRoutinesMutex);
    list->prepend(p);
}